

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

void __thiscall Player::fillArea(Player *this)

{
  ostream *poVar1;
  int id;
  int id_00;
  int length;
  string local_50;
  
  UI::clearScreen();
  poVar1 = std::operator<<((ostream *)&std::cout,"Now fills: ");
  getName_abi_cxx11_(&local_50,this);
  poVar1 = std::operator<<(poVar1,(string *)&local_50);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_50);
  if (this->role == false) {
    Keyboard::getch();
    poVar1 = std::operator<<((ostream *)&std::cout,"Computer already placed his ships!");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::operator<<((ostream *)&std::cout,"Press any key to continue... ");
  Keyboard::getch();
  id_00 = 0;
  length = 4;
  do {
    switch(id_00) {
    case 0:
      length = 4;
      break;
    case 1:
      length = 3;
      break;
    case 3:
      length = 2;
      break;
    case 6:
      length = 1;
      break;
    case 10:
      return;
    }
    if (this->role == true) {
      local_50._M_dataplus._M_p._0_4_ = 0;
      while ((int)local_50._M_dataplus._M_p != 10) {
        placeShipWithResponse(this,length,id_00,(int *)&local_50);
      }
    }
    else {
      AI::recommendAndSetShipPlacement(this,length,id_00);
    }
    id_00 = id_00 + 1;
  } while( true );
}

Assistant:

void Player::fillArea()
{
    UI::clearScreen();
    std::cout << "Now fills: " << getName() << std::endl;

    if (!getRole())
    {
        Keyboard::getch();
        std::cout << "Computer already placed his ships!" << std::endl;
    }
    std::cout << "Press any key to continue... ";
    Keyboard::getch();

    int responseCode = 0;
    int length = 4;

    for(int id = 0; id < 10; id++)
    {
        switch (id)
        {
            case 0: length = 4;
                break;
            case 1:
                length = 3;
                break;

            case 3:
                length = 2;
                break;

            case 6:
                length = 1;
            default:
                break;
        }

        if (getRole()) //if human plays
        {
            responseCode = 0;
            while (responseCode != Player::SUCCEDPLACEMENT_CODE)
            {
                placeShipWithResponse(length, id, responseCode);
            }
        }
        else //if computer
            AI::recommendAndSetShipPlacement(*this, length, id);
    }




//    responseCode = 0;
//    while (responseCode != Player::SUCCEDPLACEMENT_CODE)
//        placeShipWithResponse(3,1, responseCode);
//
//    responseCode = 0;
//    while (responseCode != Player::SUCCEDPLACEMENT_CODE)
//        placeShipWithResponse(3,2, responseCode);
//
//    responseCode = 0;
//    while (responseCode != Player::SUCCEDPLACEMENT_CODE)
//        placeShipWithResponse(2,3, responseCode);

//    responseCode = 0;
//    while (responseCode != Player::SUCCEDPLACEMENT_CODE)
//        placeShipWithResponse(2,4, responseCode);
//
//    responseCode = 0;
//    while (responseCode != Player::SUCCEDPLACEMENT_CODE)
//        placeShipWithResponse(2,5, responseCode);
//
//    responseCode = 0;
//    while (responseCode != Player::SUCCEDPLACEMENT_CODE)
//        placeShipWithResponse(1,6, responseCode);
//
//    responseCode = 0;
//    while (responseCode != Player::SUCCEDPLACEMENT_CODE)
//        placeShipWithResponse(1,7, responseCode);
//
//    responseCode = 0;
//    while (responseCode != Player::SUCCEDPLACEMENT_CODE)
//        placeShipWithResponse(1,8, responseCode);
//
//    responseCode = 0;
//    while (responseCode != Player::SUCCEDPLACEMENT_CODE)
//        placeShipWithResponse(1,9, responseCode);

}